

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

substr __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::emit_as(Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,EmitType_e type,Tree *t,size_t id,bool error_on_excess)

{
  code *pcVar1;
  undefined1 auVar2 [16];
  Location LVar3;
  Location LVar4;
  Location LVar5;
  bool bVar6;
  error_flags eVar7;
  ulong uVar8;
  substr sVar9;
  char msg [27];
  char local_b8 [32];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  char *pcStack_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  char *pcStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  char *pcStack_30;
  undefined8 local_28;
  
  if (t->m_size == 0) {
    if (id == 0xffffffffffffffff) {
      uVar8 = 0;
    }
    else {
      builtin_strncpy(local_b8 + 0x10,"d == NONE)",0xb);
      builtin_strncpy(local_b8,"check failed: (i",0x10);
      eVar7 = get_error_flags();
      if ((eVar7 & 1) != 0) {
        bVar6 = is_debugger_attached();
        if (bVar6) {
          pcVar1 = (code *)swi(3);
          sVar9 = (substr)(*pcVar1)();
          return sVar9;
        }
      }
      uVar8 = 0;
      local_48 = 0;
      uStack_40 = 0x581c;
      local_38 = 0;
      pcStack_30 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_28 = 0x65;
      LVar4.super_LineCol.col = 0;
      LVar4.super_LineCol.offset = SUB168(ZEXT816(0x581c) << 0x40,0);
      LVar4.super_LineCol.line = SUB168(ZEXT816(0x581c) << 0x40,8);
      LVar4.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar4.name.len = 0x65;
      (*(t->m_callbacks).m_error)(local_b8,0x1b,LVar4,(t->m_callbacks).m_user_data);
    }
  }
  else {
    if (t->m_size <= id) {
      builtin_strncpy(local_b8 + 0x10," < t.size()",0xc);
      builtin_strncpy(local_b8,"check failed: id",0x10);
      eVar7 = get_error_flags();
      if ((eVar7 & 1) != 0) {
        bVar6 = is_debugger_attached();
        if (bVar6) {
          pcVar1 = (code *)swi(3);
          sVar9 = (substr)(*pcVar1)();
          return sVar9;
        }
      }
      local_70 = 0;
      uStack_68 = 0x581f;
      local_60 = 0;
      pcStack_58 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_50 = 0x65;
      LVar3.super_LineCol.col = 0;
      LVar3.super_LineCol.offset = SUB168(ZEXT816(0x581f) << 0x40,0);
      LVar3.super_LineCol.line = SUB168(ZEXT816(0x581f) << 0x40,8);
      LVar3.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar3.name.len = 0x65;
      (*(t->m_callbacks).m_error)(local_b8,0x1c,LVar3,(t->m_callbacks).m_user_data);
    }
    this->m_tree = t;
    if (type == EMIT_JSON) {
      _do_visit_json(this,id);
    }
    else if (type == EMIT_YAML) {
      _emit_yaml(this,id);
    }
    else {
      builtin_strncpy(local_b8,"unknown emit type",0x12);
      eVar7 = get_error_flags();
      if ((eVar7 & 1) != 0) {
        bVar6 = is_debugger_attached();
        if (bVar6) {
          pcVar1 = (code *)swi(3);
          sVar9 = (substr)(*pcVar1)();
          return sVar9;
        }
      }
      local_98 = 0;
      uStack_90 = 0x5826;
      local_88 = 0;
      pcStack_80 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_78 = 0x65;
      LVar5.super_LineCol.col = 0;
      LVar5.super_LineCol.offset = SUB168(ZEXT816(0x5826) << 0x40,0);
      LVar5.super_LineCol.line = SUB168(ZEXT816(0x5826) << 0x40,8);
      LVar5.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar5.name.len = 0x65;
      (*(this->m_tree->m_callbacks).m_error)
                (local_b8,0x12,LVar5,(this->m_tree->m_callbacks).m_user_data);
    }
    uVar8 = (this->
            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).m_pos;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar8;
  return (substr)(auVar2 << 0x40);
}

Assistant:

substr Emitter<Writer>::emit_as(EmitType_e type, Tree const& t, size_t id, bool error_on_excess)
{
    if(t.empty())
    {
        _RYML_CB_ASSERT(t.callbacks(), id == NONE);
        return {};
    }
    _RYML_CB_CHECK(t.callbacks(), id < t.size());
    m_tree = &t;
    if(type == EMIT_YAML)
        _emit_yaml(id);
    else if(type == EMIT_JSON)
        _do_visit_json(id);
    else
        _RYML_CB_ERR(m_tree->callbacks(), "unknown emit type");
    return this->Writer::_get(error_on_excess);
}